

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

ValidRowInfo * __thiscall
duckdb::StringValueScanner::TryRow
          (ValidRowInfo *__return_storage_ptr__,StringValueScanner *this,CSVState state,
          idx_t start_pos,idx_t end_pos)

{
  bool bVar1;
  long lVar2;
  CSVIterator *pCVar3;
  CSVIterator *pCVar4;
  idx_t *piVar5;
  idx_t iVar6;
  byte bVar7;
  CSVIterator in_stack_ffffffffffffff08;
  bool local_a9;
  CSVIterator current_iterator;
  CSVIterator iterator_start;
  
  bVar7 = 0;
  pCVar3 = &(this->super_BaseScanner).iterator;
  pCVar4 = &current_iterator;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pCVar4->pos).buffer_idx = (pCVar3->pos).buffer_idx;
    pCVar3 = (CSVIterator *)&(pCVar3->pos).buffer_pos;
    pCVar4 = (CSVIterator *)&(pCVar4->pos).buffer_pos;
  }
  local_a9 = false;
  current_iterator.boundary.buffer_pos = start_pos;
  current_iterator.boundary.end_pos = end_pos;
  bVar1 = SkipUntilState(this,state,RECORD_SEPARATOR,&current_iterator,&local_a9);
  iVar6 = current_iterator.pos.buffer_pos;
  if (bVar1) {
    pCVar3 = &current_iterator;
    pCVar4 = &iterator_start;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pCVar4->pos).buffer_idx = (pCVar3->pos).buffer_idx;
      pCVar3 = (CSVIterator *)((long)pCVar3 + (ulong)bVar7 * -0x10 + 8);
      pCVar4 = (CSVIterator *)((long)pCVar4 + (ulong)bVar7 * -0x10 + 8);
    }
    current_iterator.boundary.end_pos = (this->super_BaseScanner).iterator.boundary.end_pos;
    bVar1 = IsRowValid(this,&current_iterator);
    if (bVar1) {
      if (local_a9 == false) {
        pCVar3 = &iterator_start;
        piVar5 = (idx_t *)&stack0xffffffffffffff08;
        for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
          *piVar5 = (pCVar3->pos).buffer_idx;
          pCVar3 = (CSVIterator *)((long)pCVar3 + (ulong)bVar7 * -0x10 + 8);
          piVar5 = piVar5 + (ulong)bVar7 * -2 + 1;
        }
        local_a9 = FirstValueEndsOnQuote(this,in_stack_ffffffffffffff08);
      }
      bVar1 = true;
      goto LAB_0189a000;
    }
  }
  bVar1 = false;
  iVar6 = current_iterator.pos.buffer_pos;
LAB_0189a000:
  __return_storage_ptr__->is_valid = bVar1;
  __return_storage_ptr__->start_pos = iVar6;
  __return_storage_ptr__->end_buffer_idx = current_iterator.pos.buffer_idx;
  __return_storage_ptr__->end_pos = current_iterator.pos.buffer_pos;
  __return_storage_ptr__->last_state_quote = local_a9;
  return __return_storage_ptr__;
}

Assistant:

ValidRowInfo StringValueScanner::TryRow(CSVState state, idx_t start_pos, idx_t end_pos) const {
	auto current_iterator = iterator;
	current_iterator.SetStart(start_pos);
	current_iterator.SetEnd(end_pos);
	bool quoted = false;
	if (SkipUntilState(state, CSVState::RECORD_SEPARATOR, current_iterator, quoted)) {
		auto iterator_start = current_iterator;
		idx_t current_pos = current_iterator.pos.buffer_pos;
		current_iterator.SetEnd(iterator.GetEndPos());
		if (IsRowValid(current_iterator)) {
			if (!quoted) {
				quoted = FirstValueEndsOnQuote(iterator_start);
			}
			return {true, current_pos, current_iterator.pos.buffer_idx, current_iterator.pos.buffer_pos, quoted};
		}
	}
	return {false, current_iterator.pos.buffer_pos, current_iterator.pos.buffer_idx, current_iterator.pos.buffer_pos,
	        quoted};
}